

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O0

void htable_free_all_planes(HTABLE *htable)

{
  long *in_RDI;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < (int)in_RDI[1]; local_c = local_c + 1) {
    free(*(void **)(*in_RDI + (long)local_c * 8));
  }
  free((void *)*in_RDI);
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

static void
htable_free_all_planes(HTABLE* htable)
{
    int i;

    for(i = 0; i < htable->n_planes; i++)
        free(htable->planes[i]);
    free(htable->planes);

    htable->planes = NULL;
    htable->n_planes = 0;
}